

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O2

bool FIX::IntTConvertor<unsigned_int>::convert(const_iterator str,const_iterator end,uint *result)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = 0;
  if ((str._M_current != end._M_current) && (*str._M_current != '-')) {
    do {
      if ((0x19999999 < uVar1) ||
         ((9 < (byte)(*str._M_current - 0x30U) ||
          (uVar2 = uVar1 * 10 + (uint)(byte)(*str._M_current - 0x30U), uVar2 < uVar1)))) {
        return false;
      }
      str._M_current = str._M_current + 1;
      uVar1 = uVar2;
    } while (str._M_current != end._M_current);
    *result = uVar2;
    uVar1 = 1;
  }
  return SUB41(uVar1,0);
}

Assistant:

static bool convert(std::string::const_iterator str, std::string::const_iterator end, T &result) {
    bool isNegative = false;
    typename std::make_unsigned<T>::type x = 0, nx = 0;

    if (str == end) {
      return false;
    }

    if (*str == '-' && std::is_unsigned<T>::value) {
      return false;
    }

    if (*str == '-') {
      isNegative = true;
      if (++str == end) {
        return false;
      }
    }

    do {
      if (x > OVERFLOW_MAX) {
        return false; // overflow
      }
      const unsigned char c = *str - '0';
      if (c > 9) {
        return false;
      }
      nx = 10 * x + c;
      if (nx < x) {
        return false; // overflow
      }
      x = nx;
    } while (++str != end);

    if (isNegative) {
      if (nx > UNSIGNED_VALUE_OF(VALUE_MIN)) {
        return false; // overflow
      }
    } else if (nx > VALUE_MAX) {
      return false; // overflow
    }

    PRAGMA_PUSH(4146);
    if (isNegative) {
      x = -x;
    }
    PRAGMA_POP;

    result = x;
    return true;
  }